

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O1

void vkt::api::anon_unknown_0::android::checkExtensions
               (ResultCollector *results,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *allowedExtensions,
               vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
               *reportedExtensions)

{
  bool bVar1;
  bool bVar2;
  const_iterator cVar3;
  pointer __s;
  string extensionName;
  bool local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b0;
  string local_a8;
  string local_88;
  ResultCollector *local_68;
  _Base_ptr local_60;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *local_58;
  string local_50;
  
  __s = (reportedExtensions->
        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>).
        _M_impl.super__Vector_impl_data._M_start;
  if (__s != (reportedExtensions->
             super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
    local_60 = &(allowedExtensions->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_b0 = &allowedExtensions->_M_t;
    local_68 = results;
    local_58 = reportedExtensions;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,__s->extensionName,(allocator<char> *)&local_d0);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"VK_KHX_","");
      bVar1 = de::beginsWith(&local_50,&local_d0);
      local_d9 = true;
      if (bVar1) {
LAB_0044f8eb:
        bVar2 = false;
      }
      else {
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"VK_GOOGLE_","");
        bVar2 = de::beginsWith(&local_50,&local_a8);
        if (bVar2) goto LAB_0044f8eb;
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"VK_ANDROID_","");
        local_d9 = de::beginsWith(&local_50,&local_88);
        bVar2 = true;
      }
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2)) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((!bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2)) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (local_d9 != false) {
        cVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(local_b0,&local_50);
        if (cVar3._M_node == local_60) {
          std::operator+(&local_d0,"Unknown extension: ",&local_50);
          tcu::ResultCollector::fail(local_68,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      __s = __s + 1;
    } while (__s != (local_58->
                    super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                    )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void checkExtensions (tcu::ResultCollector& results, const set<string>& allowedExtensions, const vector<VkExtensionProperties>& reportedExtensions)
{
	for (vector<VkExtensionProperties>::const_iterator extension = reportedExtensions.begin(); extension != reportedExtensions.end(); ++extension)
	{
		const string	extensionName	(extension->extensionName);
		const bool		mustBeKnown		= de::beginsWith(extensionName, "VK_KHX_")		||
										  de::beginsWith(extensionName, "VK_GOOGLE_")	||
										  de::beginsWith(extensionName, "VK_ANDROID_");

		if (mustBeKnown && !de::contains(allowedExtensions, extensionName))
			results.fail("Unknown extension: " + extensionName);
	}
}